

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O3

PHYSFS_Io * SZIP_openRead(void *opaque,char *path)

{
  uint uVar1;
  uint folderIndex;
  ulong outSize;
  long lVar2;
  long lVar3;
  SRes rc;
  UInt32 UVar4;
  PHYSFS_ErrorCode errcode;
  void *pvVar5;
  long lVar6;
  Byte *outBuffer;
  PHYSFS_Io *pPVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  size_t __n;
  SZIPLookToRead stream;
  ISzAlloc *in_stack_ffffffffffffbf68;
  code *local_4080;
  code *local_4078;
  long local_4070;
  ILookInStream local_4068;
  code **local_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  
  pvVar5 = __PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,path);
  if (pvVar5 == (void *)0x0) {
    return (PHYSFS_Io *)0x0;
  }
  if (*(int *)((long)pvVar5 + 0x20) != 0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_NOT_A_FILE);
    return (PHYSFS_Io *)0x0;
  }
  lVar6 = (**(code **)(*(long *)((long)opaque + 0x28) + 0x38))();
  if (lVar6 == 0) {
    return (PHYSFS_Io *)0x0;
  }
  local_4048 = &local_4080;
  local_4080 = SZIP_ISeekInStream_Read;
  local_4078 = SZIP_ISeekInStream_Seek;
  local_4040 = 0;
  uStack_4038 = 0;
  local_4068.Look = LookToRead_Look_Exact;
  local_4068.Skip = LookToRead_Skip;
  local_4068.Read = LookToRead_Read;
  local_4068.Seek = LookToRead_Seek;
  uVar1 = *(uint *)((long)pvVar5 + 0x28);
  uVar9 = (ulong)uVar1;
  folderIndex = *(uint *)(*(long *)((long)opaque + 0xf0) + uVar9 * 4);
  uVar10 = (ulong)folderIndex;
  local_4070 = lVar6;
  if (uVar10 == 0xffffffff) {
    (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(void *)0x0);
    goto LAB_0010da86;
  }
  outSize = *(ulong *)(*(long *)((long)opaque + 0x70) +
                      (ulong)((uint)*(byte *)(*(long *)((long)opaque + 0x68) + uVar10) +
                             *(int *)(*(long *)((long)opaque + 0x60) + uVar10 * 4)) * 8);
  outBuffer = (Byte *)0x0;
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(void *)0x0);
  if ((outSize == 0) ||
     (outBuffer = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,outSize), outBuffer != (Byte *)0x0)) {
    rc = SzAr_DecodeFolder((CSzAr *)((long)opaque + 0x30),folderIndex,&local_4068,
                           *(UInt64 *)((long)opaque + 0x88),outBuffer,outSize,
                           in_stack_ffffffffffffbf68);
    if (rc == 0) {
      lVar2 = *(long *)((long)opaque + 0x98);
      lVar8 = *(long *)(lVar2 + (ulong)*(uint *)(*(long *)((long)opaque + 0xe8) + uVar10 * 4) * 8);
      lVar3 = *(long *)(lVar2 + (ulong)(uVar1 + 1) * 8);
      rc = 0xb;
      if ((ulong)(lVar3 - lVar8) <= outSize) {
        lVar2 = *(long *)(lVar2 + uVar9 * 8);
        lVar8 = lVar2 - lVar8;
        __n = lVar3 - lVar2;
        if ((*(long *)((long)opaque + 0xa8) != 0) &&
           ((char)(*(char *)(*(long *)((long)opaque + 0xa8) + (ulong)(uVar1 >> 3)) <<
                  ((byte)uVar1 & 7)) < '\0')) {
          UVar4 = (*g_CrcUpdate)(0xffffffff,outBuffer + lVar8,__n,g_CrcTable);
          rc = 3;
          if ((UVar4 ^ *(uint *)(*(long *)((long)opaque + 0xb0) + uVar9 * 4)) != 0xffffffff)
          goto LAB_0010dbc9;
        }
        if (outBuffer == (Byte *)0x0) {
LAB_0010da86:
          PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
          (**(code **)(lVar6 + 0x48))(lVar6);
          return (PHYSFS_Io *)0x0;
        }
        (**(code **)(lVar6 + 0x48))(lVar6);
        pvVar5 = (*__PHYSFS_AllocatorHooks.Malloc)(__n + (__n == 0));
        if (pvVar5 != (void *)0x0) {
          if (lVar3 != lVar2) {
            memcpy(pvVar5,outBuffer + lVar8,__n);
          }
          (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,outBuffer);
          pPVar7 = __PHYSFS_createMemoryIo(pvVar5,__n,__PHYSFS_AllocatorHooks.Free);
          if (pPVar7 == (PHYSFS_Io *)0x0) {
            (*__PHYSFS_AllocatorHooks.Free)(pvVar5);
            return (PHYSFS_Io *)0x0;
          }
          return pPVar7;
        }
        PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
        goto LAB_0010dbe4;
      }
    }
  }
  else {
    rc = 2;
    outBuffer = (Byte *)0x0;
  }
LAB_0010dbc9:
  errcode = szipErrorCode(rc);
  PHYSFS_setErrorCode(errcode);
  (**(code **)(lVar6 + 0x48))(lVar6);
  if (outBuffer == (Byte *)0x0) {
    return (PHYSFS_Io *)0x0;
  }
LAB_0010dbe4:
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,outBuffer);
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *SZIP_openRead(void *opaque, const char *path)
{
    /* !!! FIXME: the current lzma sdk C API only allows you to decompress
       !!! FIXME:  the entire file at once, which isn't ideal. Fix this in the
       !!! FIXME:  SDK and then convert this all to a streaming interface. */

    SZIPinfo *info = (SZIPinfo *) opaque;
    SZIPentry *entry = (SZIPentry *) __PHYSFS_DirTreeFind(&info->tree, path);
    ISzAlloc *alloc = &SZIP_SzAlloc;
    SZIPLookToRead stream;
    PHYSFS_Io *retval = NULL;
    PHYSFS_Io *io = NULL;
    UInt32 blockIndex = 0xFFFFFFFF;
    Byte *outBuffer = NULL;
    size_t outBufferSize = 0;
    size_t offset = 0;
    size_t outSizeProcessed = 0;
    void *buf = NULL;
    SRes rc;

    BAIL_IF_ERRPASS(!entry, NULL);
    BAIL_IF(entry->tree.isdir, PHYSFS_ERR_NOT_A_FILE, NULL);

    io = info->io->duplicate(info->io);
    GOTO_IF_ERRPASS(!io, SZIP_openRead_failed);

    szipInitStream(&stream, io);

    rc = SzArEx_Extract(&info->db, &stream.lookStream.s, entry->dbidx,
                        &blockIndex, &outBuffer, &outBufferSize, &offset,
                        &outSizeProcessed, alloc, alloc);
    GOTO_IF(rc != SZ_OK, szipErrorCode(rc), SZIP_openRead_failed);
    GOTO_IF(outBuffer == NULL, PHYSFS_ERR_OUT_OF_MEMORY, SZIP_openRead_failed);

    io->destroy(io);
    io = NULL;

    buf = allocator.Malloc(outSizeProcessed ? outSizeProcessed : 1);
    GOTO_IF(buf == NULL, PHYSFS_ERR_OUT_OF_MEMORY, SZIP_openRead_failed);

    if (outSizeProcessed > 0)
        memcpy(buf, outBuffer + offset, outSizeProcessed);

    alloc->Free(alloc, outBuffer);
    outBuffer = NULL;

    retval = __PHYSFS_createMemoryIo(buf, outSizeProcessed, allocator.Free);
    GOTO_IF_ERRPASS(!retval, SZIP_openRead_failed);

    return retval;

SZIP_openRead_failed:
    if (io != NULL)
        io->destroy(io);

    if (buf)
        allocator.Free(buf);

    if (outBuffer)
        alloc->Free(alloc, outBuffer);

    return NULL;
}